

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * sx_os_path_splitext(char *ext,int ext_size,char *basename,int basename_size,char *path)

{
  code *pcVar1;
  int iVar2;
  char *pcVar3;
  char *local_58;
  char *e;
  char *end;
  char *start;
  int len;
  char *path_local;
  int basename_size_local;
  char *basename_local;
  int ext_size_local;
  char *ext_local;
  
  if (ext == path) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/os.c",0x20a
                      ,"ext != path");
    pcVar1 = (code *)swi(3);
    pcVar3 = (char *)(*pcVar1)();
    return pcVar3;
  }
  iVar2 = sx_strlen(path);
  if (0 < iVar2) {
    end = sx_strrchar(path,'/');
    if (end == (char *)0x0) {
      end = sx_strrchar(path,'\\');
    }
    if (end == (char *)0x0) {
      end = path;
    }
    for (local_58 = end; local_58 < path + (iVar2 + -1); local_58 = local_58 + 1) {
      if (*local_58 == '.') {
        sx_strcpy(ext,ext_size,local_58);
        if (basename != path) {
          sx_strncpy(basename,basename_size,path,(int)local_58 - (int)path);
          return ext;
        }
        *local_58 = '\0';
        return ext;
      }
    }
  }
  *ext = '\0';
  if (basename != path) {
    sx_strcpy(basename,basename_size,path);
  }
  return ext;
}

Assistant:

char* sx_os_path_splitext(char* ext, int ext_size, char* basename, int basename_size,
                          const char* path)
{
    sx_assert(ext != path);

    int len = sx_strlen(path);
    if (len > 0) {
        const char* start = sx_strrchar(path, '/');
        if (!start)
            start = sx_strrchar(path, '\\');
        if (!start)
            start = path;
        const char* end = &path[len - 1];
        for (const char* e = start; e < end; ++e) {
            if (*e != '.')
                continue;
            sx_strcpy(ext, ext_size, e);
            if (basename != path)
                sx_strncpy(basename, basename_size, path, (int)(intptr_t)(e - path));
            else
                *((char*)e) = '\0';
            return ext;
        }
    }

    // no extension (.) found
    ext[0] = '\0';
    if (basename != path)
        sx_strcpy(basename, basename_size, path);
    return ext;
}